

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_futime(uv_loop_t *loop,uv_fs_t *req,uv_file file,double atime,double mtime,uv_fs_cb cb)

{
  _func_void_uv__work_ptr_int *in_RCX;
  undefined4 in_EDX;
  uv_req_t *in_RSI;
  uv_loop_t *in_RDI;
  uv__work *in_XMM0_Qa;
  uv__work *in_XMM1_Qa;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  uv__req_init(in_RDI,in_RSI,UV_FS);
  *(undefined4 *)&in_RSI[1].data = 0xb;
  in_RSI[1].active_queue[1] = (void *)0x0;
  in_RSI[2].data = (void *)0x0;
  *(uv_loop_t **)&in_RSI[1].type = in_RDI;
  *(undefined8 *)&in_RSI[2].type = 0;
  in_RSI[7].active_queue[0] = (void *)0x0;
  in_RSI[1].active_queue[0] = in_RCX;
  *(undefined4 *)(in_RSI[7].active_queue + 1) = in_EDX;
  *(uv__work **)&in_RSI[9].type = in_XMM0_Qa;
  in_RSI[9].active_queue[0] = in_XMM1_Qa;
  if (in_RCX == (_func_void_uv__work_ptr_int *)0x0) {
    uv__fs_work((uv__work *)in_RDI);
    uv__fs_done(in_XMM1_Qa,(int)((ulong)in_RCX >> 0x20));
    local_4 = (int)in_RSI[1].active_queue[1];
  }
  else {
    uv__work_submit((uv_loop_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_XMM0_Qa,
                    (_func_void_uv__work_ptr *)in_XMM1_Qa,in_RCX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int uv_fs_futime(uv_loop_t* loop,
                 uv_fs_t* req,
                 uv_file file,
                 double atime,
                 double mtime,
                 uv_fs_cb cb) {
  INIT(FUTIME);
  req->file = file;
  req->atime = atime;
  req->mtime = mtime;
  POST;
}